

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O3

undefined8 __thiscall despot::Pocman::NextPos(Pocman *this,Coord *from,int dir)

{
  byte *pbVar1;
  int iVar2;
  Coord *this_00;
  int iVar3;
  Coord nextPos;
  long local_38;
  long local_30;
  Coord local_28 [8];
  
  this_00 = (Coord *)&local_38;
  despot::Coord::Coord((Coord *)&local_38);
  if (((*(int *)from == 0) && (dir == 3)) && (iVar2 = *(int *)(from + 4), iVar2 == this->passage_y_)
     ) {
    iVar3 = (this->maze_).xsize_ + -1;
LAB_00108f78:
    despot::Coord::Coord((Coord *)&local_30,iVar3,iVar2);
  }
  else {
    if (((*(int *)from == (this->maze_).xsize_ + -1) && (dir == 1)) &&
       (iVar2 = *(int *)(from + 4), iVar2 == this->passage_y_)) {
      iVar3 = 0;
      goto LAB_00108f78;
    }
    local_30 = despot::operator+(from,(Coord *)(&Compass::DIRECTIONS + dir));
  }
  local_38 = local_30;
  if (((-1 < (int)local_30) && (-1 < local_30)) &&
     (((int)local_30 < (this->maze_).xsize_ &&
      ((int)((ulong)local_30 >> 0x20) < (this->maze_).ysize_)))) {
    pbVar1 = (byte *)Grid<int>::operator()(&this->maze_,(Coord *)&local_38);
    if ((*pbVar1 & 1) != 0) goto LAB_00108fc8;
  }
  this_00 = local_28;
  despot::Coord::Coord(this_00,-1,-1);
LAB_00108fc8:
  return *(undefined8 *)this_00;
}

Assistant:

Coord Pocman::NextPos(const Coord& from, int dir) const {
	Coord nextPos;
	if (from.x == 0 && from.y == passage_y_ && dir == Compass::WEST)
		nextPos = Coord(maze_.xsize() - 1, from.y);
	else if (from.x == maze_.xsize() - 1 && from.y == passage_y_
		&& dir == Compass::EAST)
		nextPos = Coord(0, from.y);
	else
		nextPos = from + Compass::DIRECTIONS[dir];

	if (maze_.Inside(nextPos) && Passable(nextPos))
		return nextPos;
	else
		return Coord(-1, -1);
}